

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O2

uchar __thiscall
EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y,int levind)

{
  return this->AddLevelGrid2D[levind][X][Y];
}

Assistant:

unsigned char EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(int X, int Y, int levind)
{
#if DEBUG
    if(levind >= numofadditionalzlevs)
    {
        SBPL_ERROR("ERROR: GetMapCost invoked at level %d\n", levind);
        SBPL_FPRINTF(fDeb, "ERROR: GetMapCost invoked at level %d\n", levind);
        return false;
    }
#endif

    return AddLevelGrid2D[levind][X][Y];
}